

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::fastpackwithoutmask_32(uint32_t *in,uint32_t *out,uint32_t bit)

{
  logic_error *this;
  undefined4 in_EDX;
  uint32_t *in_RSI;
  uint32_t *in_RDI;
  uint32_t *local_8;
  
  switch(in_EDX) {
  case 0:
    local_8 = nullpacker(in_RDI,in_RSI);
    break;
  case 1:
    local_8 = __fastpackwithoutmask1_32(in_RDI,in_RSI);
    break;
  case 2:
    local_8 = __fastpackwithoutmask2_32(in_RDI,in_RSI);
    break;
  case 3:
    local_8 = __fastpackwithoutmask3_32(in_RDI,in_RSI);
    break;
  case 4:
    local_8 = __fastpackwithoutmask4_32(in_RDI,in_RSI);
    break;
  case 5:
    local_8 = __fastpackwithoutmask5_32(in_RDI,in_RSI);
    break;
  case 6:
    local_8 = __fastpackwithoutmask6_32(in_RDI,in_RSI);
    break;
  case 7:
    local_8 = __fastpackwithoutmask7_32(in_RDI,in_RSI);
    break;
  case 8:
    local_8 = __fastpackwithoutmask8_32(in_RDI,in_RSI);
    break;
  case 9:
    local_8 = __fastpackwithoutmask9_32(in_RDI,in_RSI);
    break;
  case 10:
    local_8 = __fastpackwithoutmask10_32(in_RDI,in_RSI);
    break;
  case 0xb:
    local_8 = __fastpackwithoutmask11_32(in_RDI,in_RSI);
    break;
  case 0xc:
    local_8 = __fastpackwithoutmask12_32(in_RDI,in_RSI);
    break;
  case 0xd:
    local_8 = __fastpackwithoutmask13_32(in_RDI,in_RSI);
    break;
  case 0xe:
    local_8 = __fastpackwithoutmask14_32(in_RDI,in_RSI);
    break;
  case 0xf:
    local_8 = __fastpackwithoutmask15_32(in_RDI,in_RSI);
    break;
  case 0x10:
    local_8 = __fastpackwithoutmask16_32(in_RDI,in_RSI);
    break;
  case 0x11:
    local_8 = __fastpackwithoutmask17_32(in_RDI,in_RSI);
    break;
  case 0x12:
    local_8 = __fastpackwithoutmask18_32(in_RDI,in_RSI);
    break;
  case 0x13:
    local_8 = __fastpackwithoutmask19_32(in_RDI,in_RSI);
    break;
  case 0x14:
    local_8 = __fastpackwithoutmask20_32(in_RDI,in_RSI);
    break;
  case 0x15:
    local_8 = __fastpackwithoutmask21_32(in_RDI,in_RSI);
    break;
  case 0x16:
    local_8 = __fastpackwithoutmask22_32(in_RDI,in_RSI);
    break;
  case 0x17:
    local_8 = __fastpackwithoutmask23_32(in_RDI,in_RSI);
    break;
  case 0x18:
    local_8 = __fastpackwithoutmask24_32(in_RDI,in_RSI);
    break;
  case 0x19:
    local_8 = __fastpackwithoutmask25_32(in_RDI,in_RSI);
    break;
  case 0x1a:
    local_8 = __fastpackwithoutmask26_32(in_RDI,in_RSI);
    break;
  case 0x1b:
    local_8 = __fastpackwithoutmask27_32(in_RDI,in_RSI);
    break;
  case 0x1c:
    local_8 = __fastpackwithoutmask28_32(in_RDI,in_RSI);
    break;
  case 0x1d:
    local_8 = __fastpackwithoutmask29_32(in_RDI,in_RSI);
    break;
  case 0x1e:
    local_8 = __fastpackwithoutmask30_32(in_RDI,in_RSI);
    break;
  case 0x1f:
    local_8 = __fastpackwithoutmask31_32(in_RDI,in_RSI);
    break;
  case 0x20:
    local_8 = __fastpackwithoutmask32_32(in_RDI,in_RSI);
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"number of bits is unsupported");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_8;
}

Assistant:

uint32_t *fastpackwithoutmask_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out,
                                 const uint32_t bit) {
  switch (bit) {
  case 0:
    return nullpacker(in, out);

  case 1:
    return __fastpackwithoutmask1_32(in, out);

  case 2:
    return __fastpackwithoutmask2_32(in, out);

  case 3:
    return __fastpackwithoutmask3_32(in, out);

  case 4:
    return __fastpackwithoutmask4_32(in, out);

  case 5:
    return __fastpackwithoutmask5_32(in, out);

  case 6:
    return __fastpackwithoutmask6_32(in, out);

  case 7:
    return __fastpackwithoutmask7_32(in, out);

  case 8:
    return __fastpackwithoutmask8_32(in, out);

  case 9:
    return __fastpackwithoutmask9_32(in, out);

  case 10:
    return __fastpackwithoutmask10_32(in, out);

  case 11:
    return __fastpackwithoutmask11_32(in, out);

  case 12:
    return __fastpackwithoutmask12_32(in, out);

  case 13:
    return __fastpackwithoutmask13_32(in, out);

  case 14:
    return __fastpackwithoutmask14_32(in, out);

  case 15:
    return __fastpackwithoutmask15_32(in, out);

  case 16:
    return __fastpackwithoutmask16_32(in, out);

  case 17:
    return __fastpackwithoutmask17_32(in, out);

  case 18:
    return __fastpackwithoutmask18_32(in, out);

  case 19:
    return __fastpackwithoutmask19_32(in, out);

  case 20:
    return __fastpackwithoutmask20_32(in, out);

  case 21:
    return __fastpackwithoutmask21_32(in, out);

  case 22:
    return __fastpackwithoutmask22_32(in, out);

  case 23:
    return __fastpackwithoutmask23_32(in, out);

  case 24:
    return __fastpackwithoutmask24_32(in, out);

  case 25:
    return __fastpackwithoutmask25_32(in, out);

  case 26:
    return __fastpackwithoutmask26_32(in, out);

  case 27:
    return __fastpackwithoutmask27_32(in, out);

  case 28:
    return __fastpackwithoutmask28_32(in, out);

  case 29:
    return __fastpackwithoutmask29_32(in, out);

  case 30:
    return __fastpackwithoutmask30_32(in, out);

  case 31:
    return __fastpackwithoutmask31_32(in, out);

  case 32:
    return __fastpackwithoutmask32_32(in, out);

  default:
    break;
  }
  throw std::logic_error("number of bits is unsupported");
}